

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O1

bool __thiscall
HighsPrimalHeuristics::linesearchRounding
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *point1,
          vector<double,_std::allocator<double>_> *point2,int solution_source)

{
  double dVar1;
  pointer piVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  long lVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  pointer piVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  vector<double,_std::allocator<double>_> roundedpoint;
  double local_c8;
  double local_b8;
  vector<double,_std::allocator<double>_> local_48;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar2 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar11 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_48,(long)this->mipsolver->model_->num_col_);
  uVar14 = (ulong)((long)piVar2 - (long)piVar11) >> 2;
  local_c8 = 0.0;
  do {
    pdVar7 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1.0 <= local_c8) {
      bVar9 = false;
      break;
    }
    if ((int)uVar14 == 0) {
      bVar9 = true;
      local_b8 = 1.0;
    }
    else {
      piVar2 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      _Var3._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      lVar4 = *(long *)&((_Var3._M_head_impl)->uplocks).
                        super__Vector_base<int,_std::allocator<int>_>;
      pdVar5 = (point1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (point2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar9 = true;
      uVar10 = 0;
      local_b8 = 1.0;
      do {
        lVar13 = (long)piVar2[uVar10];
        if (*(int *)(lVar4 + lVar13 * 4) == 0) {
          dVar17 = pdVar6[lVar13];
          if (pdVar6[lVar13] <= pdVar5[lVar13]) {
            dVar17 = pdVar5[lVar13];
          }
          dVar17 = ceil(dVar17 - (_Var3._M_head_impl)->feastol);
LAB_002dc1e8:
          pdVar7[lVar13] = dVar17;
        }
        else {
          if (*(int *)(*(long *)&((_Var3._M_head_impl)->downlocks).
                                 super__Vector_base<int,_std::allocator<int>_> + lVar13 * 4) == 0) {
            dVar17 = pdVar6[lVar13];
            if (pdVar5[lVar13] <= pdVar6[lVar13]) {
              dVar17 = pdVar5[lVar13];
            }
            dVar17 = floor(dVar17 + (_Var3._M_head_impl)->feastol);
            goto LAB_002dc1e8;
          }
          dVar17 = pdVar6[lVar13];
          dVar1 = pdVar5[lVar13];
          dVar16 = floor(dVar17 + 0.5);
          dVar17 = floor(dVar1 * (1.0 - local_c8) + local_c8 * dVar17 + 0.5);
          pdVar7[lVar13] = dVar17;
          if ((dVar17 != dVar16) || (NAN(dVar17) || NAN(dVar16))) {
            dVar17 = ((dVar17 + 0.5 + (_Var3._M_head_impl)->feastol) - pdVar5[lVar13]) /
                     ABS(pdVar6[lVar13] - pdVar5[lVar13]);
            uVar15 = -(ulong)(local_c8 + 0.01 < dVar17);
            local_b8 = (double)(~-(ulong)(dVar17 < local_b8) & (ulong)local_b8 |
                               (~uVar15 & (ulong)local_b8 | uVar15 & (ulong)dVar17) &
                               -(ulong)(dVar17 < local_b8));
            bVar9 = false;
          }
        }
        uVar10 = uVar10 + 1;
      } while ((uVar14 & 0xffffffff) != uVar10);
    }
    bVar8 = tryRoundedPoint(this,&local_48,solution_source);
    if (bVar8) {
      piVar11 = (pointer)0x1;
      bVar12 = 0;
    }
    else {
      if (!bVar9) {
        local_c8 = local_b8;
      }
      bVar12 = bVar9 ^ 1;
      piVar11 = (pointer)(ulong)((byte)piVar11 & bVar12);
    }
    bVar9 = SUB81(piVar11,0);
  } while (bVar12 != 0);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

bool HighsPrimalHeuristics::linesearchRounding(
    const std::vector<double>& point1, const std::vector<double>& point2,
    const int solution_source) {
  std::vector<double> roundedpoint;

  HighsInt numintcols = intcols.size();
  roundedpoint.resize(mipsolver.numCol());

  double alpha = 0.0;
  assert(int(mipsolver.mipdata_->uplocks.size()) == mipsolver.numCol());
  assert(int(point1.size()) == mipsolver.numCol());
  assert(int(point2.size()) == mipsolver.numCol());

  while (alpha < 1.0) {
    double nextalpha = 1.0;
    bool reachedpoint2 = true;
    // printf("trying alpha = %g\n", alpha);
    for (HighsInt i = 0; i != numintcols; ++i) {
      HighsInt col = intcols[i];
      assert(col >= 0);
      assert(col < mipsolver.numCol());
      if (mipsolver.mipdata_->uplocks[col] == 0) {
        roundedpoint[col] = std::ceil(std::max(point1[col], point2[col]) -
                                      mipsolver.mipdata_->feastol);
        continue;
      }

      if (mipsolver.mipdata_->downlocks[col] == 0) {
        roundedpoint[col] = std::floor(std::min(point1[col], point2[col]) +
                                       mipsolver.mipdata_->feastol);
        continue;
      }

      double convexcomb = (1.0 - alpha) * point1[col] + alpha * point2[col];
      double intpoint2 = std::floor(point2[col] + 0.5);
      roundedpoint[col] = std::floor(convexcomb + 0.5);

      if (roundedpoint[col] == intpoint2) continue;

      reachedpoint2 = false;
      double tmpalpha = (roundedpoint[col] + 0.5 + mipsolver.mipdata_->feastol -
                         point1[col]) /
                        std::abs(point2[col] - point1[col]);
      if (tmpalpha < nextalpha && tmpalpha > alpha + 1e-2) nextalpha = tmpalpha;
    }

    if (tryRoundedPoint(roundedpoint, solution_source)) return true;

    if (reachedpoint2) return false;

    alpha = nextalpha;
  }

  return false;
}